

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

SQWeakRef * __thiscall SQRefCounted::GetWeakRef(SQRefCounted *this,SQObjectType type)

{
  void *pvVar1;
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    pvVar1 = sq_vm_malloc(0x136b67);
    *(void **)(in_RDI + 0x10) = pvVar1;
    SQWeakRef::SQWeakRef((SQWeakRef *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x18) = in_ESI;
    *(long *)(*(long *)(in_RDI + 0x10) + 0x20) = in_RDI;
  }
  return *(SQWeakRef **)(in_RDI + 0x10);
}

Assistant:

SQWeakRef *SQRefCounted::GetWeakRef(SQObjectType type)
{
    if(!_weakref) {
        sq_new(_weakref,SQWeakRef);
#if defined(SQUSEDOUBLE) && !defined(_SQ64)
        _weakref->_obj._unVal.raw = 0; //clean the whole union on 32 bits with double
#endif
        _weakref->_obj._type = type;
        _weakref->_obj._unVal.pRefCounted = this;
    }
    return _weakref;
}